

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sid.cc
# Opt level: O0

ssize_t __thiscall SID::write(SID *this,int __fd,void *__buf,size_t __n)

{
  ulong uVar1;
  ssize_t sVar2;
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  ssize_t extraout_RAX_01;
  ssize_t extraout_RAX_02;
  ssize_t extraout_RAX_03;
  ssize_t extraout_RAX_04;
  ssize_t extraout_RAX_05;
  ssize_t extraout_RAX_06;
  ssize_t extraout_RAX_07;
  ssize_t extraout_RAX_08;
  ssize_t extraout_RAX_09;
  ssize_t extraout_RAX_10;
  ssize_t extraout_RAX_11;
  ssize_t extraout_RAX_12;
  ssize_t extraout_RAX_13;
  ssize_t extraout_RAX_14;
  ssize_t extraout_RAX_15;
  ssize_t extraout_RAX_16;
  ssize_t extraout_RAX_17;
  ssize_t extraout_RAX_18;
  ssize_t extraout_RAX_19;
  ssize_t extraout_RAX_20;
  ssize_t extraout_RAX_21;
  ssize_t extraout_RAX_22;
  ssize_t extraout_RAX_23;
  reg8 mode_vol;
  reg8 in_stack_ffffffffffffffdc;
  
  mode_vol = (reg8)__buf;
  this->bus_value = mode_vol;
  this->bus_value_ttl = 0x2000;
  uVar1 = (ulong)(uint)__fd;
  sVar2 = uVar1 - 0x18;
  if (uVar1 < 0x18 || sVar2 == 0) {
    switch((long)&switchD_001860a5::switchdataD_002ea130 +
           (long)(int)(&switchD_001860a5::switchdataD_002ea130)[uVar1]) {
    case 0x1860a7:
      WaveformGenerator::writeFREQ_LO((WaveformGenerator *)this,mode_vol);
      sVar2 = extraout_RAX;
      break;
    case 0x1860ba:
      WaveformGenerator::writeFREQ_HI((WaveformGenerator *)this,mode_vol);
      sVar2 = extraout_RAX_00;
      break;
    case 0x1860cd:
      WaveformGenerator::writePW_LO((WaveformGenerator *)this,mode_vol);
      sVar2 = extraout_RAX_01;
      break;
    case 0x1860e0:
      WaveformGenerator::writePW_HI((WaveformGenerator *)this,mode_vol);
      sVar2 = extraout_RAX_02;
      break;
    case 0x1860f3:
      Voice::writeCONTROL_REG((Voice *)this,in_stack_ffffffffffffffdc);
      sVar2 = extraout_RAX_03;
      break;
    case 0x186106:
      EnvelopeGenerator::writeATTACK_DECAY((EnvelopeGenerator *)&this->field_0x58,mode_vol);
      sVar2 = extraout_RAX_04;
      break;
    case 0x18611d:
      EnvelopeGenerator::writeSUSTAIN_RELEASE((EnvelopeGenerator *)&this->field_0x58,mode_vol);
      sVar2 = extraout_RAX_05;
      break;
    case 0x186134:
      WaveformGenerator::writeFREQ_LO((WaveformGenerator *)&this->field_0x90,mode_vol);
      sVar2 = extraout_RAX_06;
      break;
    case 0x18614e:
      WaveformGenerator::writeFREQ_HI((WaveformGenerator *)&this->field_0x90,mode_vol);
      sVar2 = extraout_RAX_07;
      break;
    case 0x186168:
      WaveformGenerator::writePW_LO((WaveformGenerator *)&this->field_0x90,mode_vol);
      sVar2 = extraout_RAX_08;
      break;
    case 0x186182:
      WaveformGenerator::writePW_HI((WaveformGenerator *)&this->field_0x90,mode_vol);
      sVar2 = extraout_RAX_09;
      break;
    case 0x18619c:
      Voice::writeCONTROL_REG((Voice *)this,in_stack_ffffffffffffffdc);
      sVar2 = extraout_RAX_10;
      break;
    case 0x1861b6:
      EnvelopeGenerator::writeATTACK_DECAY((EnvelopeGenerator *)&this->field_0xe8,mode_vol);
      sVar2 = extraout_RAX_11;
      break;
    case 0x1861d4:
      EnvelopeGenerator::writeSUSTAIN_RELEASE((EnvelopeGenerator *)&this->field_0xe8,mode_vol);
      sVar2 = extraout_RAX_12;
      break;
    case 0x1861f2:
      WaveformGenerator::writeFREQ_LO((WaveformGenerator *)&this->field_0x120,mode_vol);
      sVar2 = extraout_RAX_13;
      break;
    case 0x18620c:
      WaveformGenerator::writeFREQ_HI((WaveformGenerator *)&this->field_0x120,mode_vol);
      sVar2 = extraout_RAX_14;
      break;
    case 0x186226:
      WaveformGenerator::writePW_LO((WaveformGenerator *)&this->field_0x120,mode_vol);
      sVar2 = extraout_RAX_15;
      break;
    case 0x186240:
      WaveformGenerator::writePW_HI((WaveformGenerator *)&this->field_0x120,mode_vol);
      sVar2 = extraout_RAX_16;
      break;
    case 0x18625a:
      Voice::writeCONTROL_REG((Voice *)this,in_stack_ffffffffffffffdc);
      sVar2 = extraout_RAX_17;
      break;
    case 0x186274:
      EnvelopeGenerator::writeATTACK_DECAY((EnvelopeGenerator *)&this->field_0x178,mode_vol);
      sVar2 = extraout_RAX_18;
      break;
    case 0x18628f:
      EnvelopeGenerator::writeSUSTAIN_RELEASE((EnvelopeGenerator *)&this->field_0x178,mode_vol);
      sVar2 = extraout_RAX_19;
      break;
    case 0x1862aa:
      Filter::writeFC_LO((Filter *)this,in_stack_ffffffffffffffdc);
      sVar2 = extraout_RAX_20;
      break;
    case 0x1862c1:
      Filter::writeFC_HI((Filter *)this,in_stack_ffffffffffffffdc);
      sVar2 = extraout_RAX_21;
      break;
    case 0x1862d8:
      Filter::writeRES_FILT((Filter *)this,in_stack_ffffffffffffffdc);
      sVar2 = extraout_RAX_22;
      break;
    case 0x1862ef:
      Filter::writeMODE_VOL(&this->filter,mode_vol);
      sVar2 = extraout_RAX_23;
    }
  }
  return sVar2;
}

Assistant:

void SID::write(reg8 offset, reg8 value)
{
  bus_value = value;
  bus_value_ttl = 0x2000;

  switch (offset) {
  case 0x00:
    voice[0].wave.writeFREQ_LO(value);
    break;
  case 0x01:
    voice[0].wave.writeFREQ_HI(value);
    break;
  case 0x02:
    voice[0].wave.writePW_LO(value);
    break;
  case 0x03:
    voice[0].wave.writePW_HI(value);
    break;
  case 0x04:
    voice[0].writeCONTROL_REG(value);
    break;
  case 0x05:
    voice[0].envelope.writeATTACK_DECAY(value);
    break;
  case 0x06:
    voice[0].envelope.writeSUSTAIN_RELEASE(value);
    break;
  case 0x07:
    voice[1].wave.writeFREQ_LO(value);
    break;
  case 0x08:
    voice[1].wave.writeFREQ_HI(value);
    break;
  case 0x09:
    voice[1].wave.writePW_LO(value);
    break;
  case 0x0a:
    voice[1].wave.writePW_HI(value);
    break;
  case 0x0b:
    voice[1].writeCONTROL_REG(value);
    break;
  case 0x0c:
    voice[1].envelope.writeATTACK_DECAY(value);
    break;
  case 0x0d:
    voice[1].envelope.writeSUSTAIN_RELEASE(value);
    break;
  case 0x0e:
    voice[2].wave.writeFREQ_LO(value);
    break;
  case 0x0f:
    voice[2].wave.writeFREQ_HI(value);
    break;
  case 0x10:
    voice[2].wave.writePW_LO(value);
    break;
  case 0x11:
    voice[2].wave.writePW_HI(value);
    break;
  case 0x12:
    voice[2].writeCONTROL_REG(value);
    break;
  case 0x13:
    voice[2].envelope.writeATTACK_DECAY(value);
    break;
  case 0x14:
    voice[2].envelope.writeSUSTAIN_RELEASE(value);
    break;
  case 0x15:
    filter.writeFC_LO(value);
    break;
  case 0x16:
    filter.writeFC_HI(value);
    break;
  case 0x17:
    filter.writeRES_FILT(value);
    break;
  case 0x18:
    filter.writeMODE_VOL(value);
    break;
  default:
    break;
  }
}